

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall QCalendarWidget::setCurrentPage(QCalendarWidget *this,int year,int month)

{
  QCalendarWidgetPrivate *this_00;
  int iVar1;
  int iVar2;
  QItemSelectionModel *pQVar3;
  long in_FS_OFFSET;
  int col;
  int row;
  QDate newDate;
  int local_78;
  int local_74;
  QDate local_70;
  undefined8 local_68;
  qint64 local_60;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QCalendarWidgetPrivate **)&(this->super_QWidget).field_0x8;
  local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex(&local_58,(QAbstractItemView *)this_00->m_view);
  local_60 = (qint64)QtPrivate::QCalendarModel::dateForCell(this_00->m_model,local_58.r,local_58.c);
  local_68 = *(undefined8 *)&this_00->m_model->m_calendar;
  iVar1 = QDate::day();
  iVar2 = QCalendar::daysInMonth((int)&local_68,month);
  if (iVar2 <= iVar1) {
    iVar1 = iVar2;
  }
  QCalendarWidgetPrivate::showMonth(this_00,year,month);
  local_70.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  QDate::QDate(&local_70,year,month,iVar1,*(undefined8 *)&this_00->m_model->m_calendar);
  local_74 = -1;
  local_78 = -1;
  QtPrivate::QCalendarModel::cellForDate(this_00->m_model,local_70,&local_74,&local_78);
  if ((local_74 != -1) && (local_78 != -1)) {
    pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this_00->m_view);
    (**(code **)(*(long *)this_00->m_model + 0x60))(&local_58,this_00->m_model,local_74,local_78);
    (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,&local_58,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidget::setCurrentPage(int year, int month)
{
    Q_D(QCalendarWidget);
    QDate currentDate = d->getCurrentDate();
    QCalendar cal = d->m_model->m_calendar;
    int day = currentDate.day(cal);
    int daysInMonths = cal.daysInMonth(month, year);
    if (day > daysInMonths)
        day = daysInMonths;

    d->showMonth(year, month);

    QDate newDate(year, month, day, d->m_model->m_calendar);
    int row = -1, col = -1;
    d->m_model->cellForDate(newDate, &row, &col);
    if (row != -1 && col != -1) {
        d->m_view->selectionModel()->setCurrentIndex(d->m_model->index(row, col),
                                                  QItemSelectionModel::NoUpdate);
    }
}